

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::OnCatchExpr(BinaryReaderIR *this,Index except_index)

{
  Result RVar1;
  Location LStack_138;
  Location local_110;
  Var local_f0;
  Catch local_a8;
  
  GetLocation(&local_110,this);
  Var::Var(&local_f0,except_index,&local_110);
  LStack_138.field_1.field_0.line = 0;
  LStack_138.field_1._4_8_ = 0;
  LStack_138.filename._M_len = 0;
  LStack_138.filename._M_str._0_4_ = 0;
  LStack_138.filename._M_str._4_4_ = 0;
  Catch::Catch(&local_a8,&local_f0,&LStack_138);
  RVar1 = AppendCatch(this,&local_a8);
  Catch::~Catch(&local_a8);
  Var::~Var(&local_f0);
  return (Result)RVar1.enum_;
}

Assistant:

Result BinaryReaderIR::OnCatchExpr(Index except_index) {
  return AppendCatch(Catch(Var(except_index, GetLocation())));
}